

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O0

void compile_limits(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *limits,uint32_t *dest,bool quiet)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  char *pcVar5;
  ostream *poVar6;
  long lVar7;
  byte in_DL;
  long in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  int n_1;
  size_t j;
  int n;
  string limit;
  size_t i;
  ulong local_58;
  string local_40 [32];
  ulong local_20;
  byte local_11;
  long local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  for (local_20 = 0; uVar1 = local_20,
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_RDI), uVar1 < sVar3; local_20 = local_20 + 1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](in_RDI,local_20);
    std::__cxx11::string::string(local_40,(string *)pvVar4);
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    iVar2 = isdigit((int)*pcVar5);
    if (iVar2 == 0) {
      lVar7 = std::__cxx11::string::size();
      if (lVar7 == 1) {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "You must specify the namespace index before the n");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      else {
        lVar7 = std::__cxx11::string::c_str();
        iVar2 = atoi((char *)(lVar7 + 1));
        lVar7 = local_10;
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
        *(int *)(lVar7 + (ulong)(uint)(int)*pcVar5 * 4) = iVar2;
        if ((local_11 & 1) == 0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"limiting to ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
          poVar6 = std::operator<<(poVar6," for namespaces ");
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
          poVar6 = std::operator<<(poVar6,*pcVar5);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      iVar2 = atoi(pcVar5);
      if ((local_11 & 1) == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"limiting to ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
        poVar6 = std::operator<<(poVar6,"features for each namespace.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      for (local_58 = 0; local_58 < 0x100; local_58 = local_58 + 1) {
        *(int *)(local_10 + local_58 * 4) = iVar2;
      }
    }
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void compile_limits(vector<string> limits, uint32_t* dest, bool quiet)
{
  for (size_t i = 0; i < limits.size(); i++)
  {
    string limit = limits[i];
    if (isdigit(limit[0]))
    {
      int n = atoi(limit.c_str());
      if (!quiet)
        cerr << "limiting to " << n << "features for each namespace." << endl;
      for (size_t j = 0; j < 256; j++) dest[j] = n;
    }
    else if (limit.size() == 1)
      cout << "You must specify the namespace index before the n" << endl;
    else
    {
      int n = atoi(limit.c_str() + 1);
      dest[(uint32_t)limit[0]] = n;
      if (!quiet)
        cerr << "limiting to " << n << " for namespaces " << limit[0] << endl;
    }
  }
}